

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_accent_type.c
# Opt level: O0

void njd_set_accent_type(NJD *njd)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long *in_RDI;
  int mora_size;
  int add_type;
  char rule [1024];
  NJDNode *top_node;
  NJDNode *node;
  _NJDNode *in_stack_fffffffffffffb78;
  NJDNode *in_stack_fffffffffffffb80;
  char local_418 [928];
  int *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  NJDNode *local_18;
  NJDNode *local_10;
  
  local_18 = (NJDNode *)0x0;
  if ((in_RDI != (long *)0x0) && (*in_RDI != 0)) {
    for (local_10 = (NJDNode *)*in_RDI; local_10 != (NJDNode *)0x0; local_10 = local_10->next) {
      pcVar3 = NJDNode_get_string(local_10);
      if (pcVar3 != (char *)0x0) {
        iVar2 = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
        if ((local_10 == (NJDNode *)*in_RDI) ||
           (iVar1 = NJDNode_get_chain_flag(local_10), iVar1 != 1)) {
          local_18 = local_10;
        }
        else if ((local_10->prev != (_NJDNode *)0x0) &&
                (iVar1 = NJDNode_get_chain_flag(local_10), iVar1 == 1)) {
          NJDNode_get_chain_rule(local_10);
          NJDNode_get_pos(local_10->prev);
          get_rule(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88);
          iVar1 = strcmp(local_418,"*");
          if ((iVar1 != 0) && (iVar1 = strcmp(local_418,"F1"), iVar1 != 0)) {
            iVar1 = strcmp(local_418,"F2");
            if (iVar1 == 0) {
              iVar1 = NJDNode_get_acc(local_18);
              if (iVar1 == 0) {
                NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
              }
            }
            else {
              iVar1 = strcmp(local_418,"F3");
              if (iVar1 == 0) {
                iVar1 = NJDNode_get_acc(local_18);
                if (iVar1 != 0) {
                  NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                }
              }
              else {
                iVar1 = strcmp(local_418,"F4");
                if (iVar1 == 0) {
                  NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                }
                else {
                  iVar1 = strcmp(local_418,"F5");
                  if (iVar1 == 0) {
                    NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                  }
                  else {
                    iVar1 = strcmp(local_418,"C1");
                    if (iVar1 == 0) {
                      NJDNode_get_acc(local_10);
                      NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                    }
                    else {
                      iVar1 = strcmp(local_418,"C2");
                      if (iVar1 == 0) {
                        NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                      }
                      else {
                        iVar1 = strcmp(local_418,anon_var_dwarf_b3047 + 0x33);
                        if (iVar1 == 0) {
                          NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                        }
                        else {
                          iVar1 = strcmp(local_418,"C4");
                          if (iVar1 == 0) {
                            NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                          }
                          else {
                            iVar1 = strcmp(local_418,"C5");
                            if (iVar1 != 0) {
                              iVar1 = strcmp(local_418,"P1");
                              if (iVar1 == 0) {
                                iVar1 = NJDNode_get_acc(local_10);
                                if (iVar1 == 0) {
                                  NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                                }
                                else {
                                  NJDNode_get_acc(local_10);
                                  NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                                }
                              }
                              else {
                                iVar1 = strcmp(local_418,"P2");
                                if (iVar1 == 0) {
                                  iVar1 = NJDNode_get_acc(local_10);
                                  if (iVar1 == 0) {
                                    NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                                  }
                                  else {
                                    NJDNode_get_acc(local_10);
                                    NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                                  }
                                }
                                else {
                                  iVar1 = strcmp(local_418,"P6");
                                  if (iVar1 == 0) {
                                    NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                                  }
                                  else {
                                    iVar1 = strcmp(local_418,"P14");
                                    if ((iVar1 == 0) &&
                                       (iVar1 = NJDNode_get_acc(local_10), iVar1 != 0)) {
                                      NJDNode_get_acc(local_10);
                                      NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ((local_10->prev != (_NJDNode *)0x0) &&
           (iVar1 = NJDNode_get_chain_flag(local_10), iVar1 == 1)) {
          pcVar3 = NJDNode_get_pos_group1(local_10->prev);
          iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
          if (iVar1 == 0) {
            pcVar3 = NJDNode_get_pos_group1(local_10);
            iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
            if (iVar1 == 0) {
              pcVar3 = NJDNode_get_string(local_10);
              iVar1 = strcmp(pcVar3,anon_var_dwarf_b2da5);
              if (iVar1 == 0) {
                pcVar3 = NJDNode_get_string(local_10->prev);
                if (pcVar3 == (char *)0x0) {
LAB_0018558f:
                  NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                }
                else {
                  pcVar3 = NJDNode_get_string(local_10->prev);
                  iVar1 = strcmp(pcVar3,anon_var_dwarf_b2e88);
                  if (iVar1 != 0) {
                    pcVar3 = NJDNode_get_string(local_10->prev);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2db0);
                    if (iVar1 != 0) {
                      pcVar3 = NJDNode_get_string(local_10->prev);
                      iVar1 = strcmp(pcVar3,anon_var_dwarf_b2f1e);
                      if (iVar1 != 0) {
                        pcVar3 = NJDNode_get_string(local_10->prev);
                        iVar1 = strcmp(pcVar3,anon_var_dwarf_b472c);
                        if (iVar1 != 0) {
                          pcVar3 = NJDNode_get_string(local_10->prev);
                          iVar1 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
                          if (iVar1 != 0) goto LAB_0018558f;
                        }
                      }
                    }
                  }
                  NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                }
                pcVar3 = NJDNode_get_string(local_10->prev);
                if (pcVar3 != (char *)0x0) {
                  pcVar3 = NJDNode_get_string(local_10->prev);
                  iVar1 = strcmp(pcVar3,anon_var_dwarf_b2cf2);
                  if (iVar1 != 0) {
                    pcVar3 = NJDNode_get_string(local_10->prev);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d08);
                    if (iVar1 != 0) {
                      pcVar3 = NJDNode_get_string(local_10->prev);
                      iVar1 = strcmp(pcVar3,anon_var_dwarf_b2f00);
                      if (iVar1 != 0) goto LAB_00185c07;
                    }
                  }
                  if ((local_10->next != (_NJDNode *)0x0) &&
                     (pcVar3 = NJDNode_get_string(local_10->next), pcVar3 != (char *)0x0)) {
                    pcVar3 = NJDNode_get_string(local_10->next);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d78);
                    if (iVar1 != 0) {
                      pcVar3 = NJDNode_get_string(local_10->next);
                      iVar1 = strcmp(pcVar3,anon_var_dwarf_b2cdc);
                      if (iVar1 != 0) {
                        pcVar3 = NJDNode_get_string(local_10->next);
                        iVar1 = strcmp(pcVar3,anon_var_dwarf_b2e88);
                        if (iVar1 != 0) {
                          pcVar3 = NJDNode_get_string(local_10->next);
                          iVar1 = strcmp(pcVar3,anon_var_dwarf_b2db0);
                          if (iVar1 != 0) {
                            pcVar3 = NJDNode_get_string(local_10->next);
                            iVar1 = strcmp(pcVar3,anon_var_dwarf_b2cf2);
                            if (iVar1 != 0) {
                              pcVar3 = NJDNode_get_string(local_10->next);
                              iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d08);
                              if (iVar1 != 0) {
                                pcVar3 = NJDNode_get_string(local_10->next);
                                iVar1 = strcmp(pcVar3,anon_var_dwarf_b2ee2);
                                if (iVar1 != 0) {
                                  pcVar3 = NJDNode_get_string(local_10->next);
                                  iVar1 = strcmp(pcVar3,anon_var_dwarf_b2f00);
                                  if (iVar1 != 0) {
                                    pcVar3 = NJDNode_get_string(local_10->next);
                                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2f1e);
                                    if (iVar1 != 0) goto LAB_00185c07;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                  }
                }
              }
              else {
                pcVar3 = NJDNode_get_string(local_10);
                iVar1 = strcmp(pcVar3,anon_var_dwarf_b33b6);
                if (iVar1 == 0) {
                  pcVar3 = NJDNode_get_string(local_10->prev);
                  if (pcVar3 != (char *)0x0) {
                    pcVar3 = NJDNode_get_string(local_10->prev);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2ee2);
                    if (iVar1 == 0) {
                      NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                      goto LAB_00185c07;
                    }
                  }
                  pcVar3 = NJDNode_get_string(local_10->prev);
                  if (pcVar3 == (char *)0x0) {
LAB_0018591f:
                    NJDNode_get_mora_size(local_10->prev);
                    NJDNode_get_mora_size(local_10);
                    NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                  }
                  else {
                    pcVar3 = NJDNode_get_string(local_10->prev);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2e88);
                    if (iVar1 != 0) {
                      pcVar3 = NJDNode_get_string(local_10->prev);
                      iVar1 = strcmp(pcVar3,anon_var_dwarf_b2db0);
                      if (iVar1 != 0) {
                        pcVar3 = NJDNode_get_string(local_10->prev);
                        iVar1 = strcmp(pcVar3,anon_var_dwarf_b2f1e);
                        if (iVar1 != 0) {
                          pcVar3 = NJDNode_get_string(local_10->prev);
                          iVar1 = strcmp(pcVar3,anon_var_dwarf_b472c);
                          if (iVar1 != 0) goto LAB_0018591f;
                        }
                      }
                    }
                    NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                  }
                }
                else {
                  pcVar3 = NJDNode_get_string(local_10);
                  iVar1 = strcmp(pcVar3,anon_var_dwarf_b4714);
                  if (iVar1 == 0) {
                    in_stack_fffffffffffffb80 = local_10->prev;
                    NJDNode_get_mora_size(local_10->prev);
                    NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                  }
                  else {
                    pcVar3 = NJDNode_get_string(local_10);
                    iVar1 = strcmp(pcVar3,anon_var_dwarf_b4720);
                    if (iVar1 == 0) {
                      in_stack_fffffffffffffb78 = local_10->prev;
                      NJDNode_get_mora_size(local_10->prev);
                      NJDNode_set_acc(in_stack_fffffffffffffb80,
                                      (int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
                    }
                    else {
                      pcVar3 = NJDNode_get_string(local_10);
                      iVar1 = strcmp(pcVar3,anon_var_dwarf_b480c);
                      if (iVar1 == 0) {
                        pcVar3 = NJDNode_get_string(local_10->prev);
                        if (pcVar3 == (char *)0x0) {
LAB_00185b2a:
                          NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                        }
                        else {
                          pcVar3 = NJDNode_get_string(local_10->prev);
                          iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d78);
                          if (iVar1 != 0) {
                            pcVar3 = NJDNode_get_string(local_10->prev);
                            iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d08);
                            if (iVar1 != 0) {
                              pcVar3 = NJDNode_get_string(local_10->prev);
                              iVar1 = strcmp(pcVar3,anon_var_dwarf_b2ee2);
                              if (iVar1 != 0) {
                                pcVar3 = NJDNode_get_string(local_10->prev);
                                iVar1 = strcmp(pcVar3,anon_var_dwarf_b2f00);
                                if (iVar1 != 0) {
                                  pcVar3 = NJDNode_get_string(local_10->prev);
                                  iVar1 = strcmp(pcVar3,anon_var_dwarf_b47e9);
                                  if (iVar1 != 0) goto LAB_00185b2a;
                                }
                              }
                            }
                          }
                          NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                        }
                      }
                      else {
                        pcVar3 = NJDNode_get_string(local_10);
                        iVar1 = strcmp(pcVar3,anon_var_dwarf_b4817);
                        if (iVar1 == 0) {
                          pcVar3 = NJDNode_get_string(local_10->prev);
                          if (pcVar3 == (char *)0x0) {
LAB_00185be3:
                            NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                          }
                          else {
                            pcVar3 = NJDNode_get_string(local_10->prev);
                            iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d08);
                            if (iVar1 != 0) {
                              pcVar3 = NJDNode_get_string(local_10->prev);
                              iVar1 = strcmp(pcVar3,anon_var_dwarf_b2ee2);
                              if (iVar1 != 0) goto LAB_00185be3;
                            }
                            NJDNode_set_acc(in_stack_fffffffffffffb80,iVar2);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_00185c07:
        pcVar3 = NJDNode_get_string(local_10);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_b2da5);
        if (((iVar2 == 0) && (iVar2 = NJDNode_get_chain_flag(local_10), iVar2 != 1)) &&
           (local_10->next != (_NJDNode *)0x0)) {
          pcVar3 = NJDNode_get_pos_group1(local_10->next);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_b48b2 + 9);
          if (iVar2 == 0) {
            NJDNode_set_acc(in_stack_fffffffffffffb80,
                            (int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
          }
        }
        NJDNode_get_mora_size(local_10);
      }
    }
  }
  return;
}

Assistant:

void njd_set_accent_type(NJD * njd)
{
   NJDNode *node;
   NJDNode *top_node = NULL;
   char rule[MAXBUFLEN];
   int add_type = 0;
   int mora_size = 0;

   if (njd == NULL || njd->head == NULL)
      return;

   for (node = njd->head; node != NULL; node = node->next) {
      if (NJDNode_get_string(node) == NULL)
         continue;
      if ((node == njd->head) || (NJDNode_get_chain_flag(node) != 1)) {
         /* store the top node */
         top_node = node;
         mora_size = 0;
      } else if (node->prev != NULL && NJDNode_get_chain_flag(node) == 1) {
         /* get accent change type */
         get_rule(NJDNode_get_chain_rule(node), NJDNode_get_pos(node->prev), rule, &add_type);

         /* change accent type */
         if (strcmp(rule, "*") == 0) {  /* no chnage */
         } else if (strcmp(rule, "F1") == 0) {  /* for ancillary word */
         } else if (strcmp(rule, "F2") == 0) {
            if (NJDNode_get_acc(top_node) == 0)
               NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F3") == 0) {
            if (NJDNode_get_acc(top_node) != 0)
               NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F4") == 0) {
            NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F5") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "C1") == 0) {  /* for noun */
            NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "C2") == 0) {
            NJDNode_set_acc(top_node, mora_size + 1);
         } else if (strcmp(rule, "C3") == 0) {
            NJDNode_set_acc(top_node, mora_size);
         } else if (strcmp(rule, "C4") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "C5") == 0) {
         } else if (strcmp(rule, "P1") == 0) {  /* for postfix */
            if (NJDNode_get_acc(node) == 0)
               NJDNode_set_acc(top_node, 0);
            else
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "P2") == 0) {
            if (NJDNode_get_acc(node) == 0)
               NJDNode_set_acc(top_node, mora_size + 1);
            else
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "P6") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "P14") == 0) {
            if (NJDNode_get_acc(node) != 0)
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         }
      }

      /* change accent type for digit */
      if (node->prev != NULL && NJDNode_get_chain_flag(node) == 1 &&
          strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_TYPE_KAZU) == 0 &&
          strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_TYPE_KAZU) == 0) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_JYUU) == 0) { /* 10^1 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SAN) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_YON) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_KYUU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NAN) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SUU) == 0)) {
               NJDNode_set_acc(node->prev, 1);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_GO) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_HACHI) == 0)) {
               if (node->next != NULL && NJDNode_get_string(node->next) != NULL
                   && (strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_ICHI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_NI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_SAN) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_YON) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_GO) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_ROKU) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_NANA) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_HACHI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_KYUU) == 0))
                  NJDNode_set_acc(node->prev, 0);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_HYAKU) == 0) { /* 10^2 */
            if (NJDNode_get_string(node->prev) != NULL
                && strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0) {
               NJDNode_set_acc(node->prev, 2);
            } else if (NJDNode_get_string(node->prev) != NULL &&
                       (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SAN) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_YON) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_KYUU) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NAN) == 0)) {
               NJDNode_set_acc(node->prev, 1);
            } else {
               NJDNode_set_acc(node->prev,
                               NJDNode_get_mora_size(node->prev) + NJDNode_get_mora_size(node));
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_SEN) == 0) {   /* 10^3 */
            NJDNode_set_acc(node->prev, NJDNode_get_mora_size(node->prev) + 1);
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_MAN) == 0) {   /* 10^4 */
            NJDNode_set_acc(node->prev, NJDNode_get_mora_size(node->prev) + 1);
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_OKU) == 0) {   /* 10^8 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ICHI) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_HACHI) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_IKU) == 0)) {
               NJDNode_set_acc(node->prev, 2);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_CHOU) == 0) {  /* 10^12 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0)) {
               NJDNode_set_acc(node->prev, 2);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
         }
      }

      if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_JYUU) == 0 &&
          NJDNode_get_chain_flag(node) != 1 && node->next != NULL &&
          strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_ACCENT_TYPE_KAZU) == 0) {
         NJDNode_set_acc(node, 0);
      }

      mora_size += NJDNode_get_mora_size(node);
   }
}